

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::SocketStream::write(SocketStream *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((SocketStream *)
        ((long)&(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream +
        (long)(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-4]),
        in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

virtual void write(const void* data, const size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

#ifdef TCP_CORK
			send(data, size);
#else
			if (size >= SEND_BUFFER_SIZE_LIMIT)
			{
				flush();
				send(data, size);
			}
			else
			{
				sendBuffer.add(data, size);
				if (sendBuffer.size() >= SEND_BUFFER_SIZE_LIMIT)
					flush();
			}
#endif
		}